

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cc
# Opt level: O0

void __thiscall tt::net::HttpData::reset(HttpData *this)

{
  bool bVar1;
  element_type *this_00;
  undefined1 local_30 [8];
  shared_ptr<tt::net::TimerNode> my_timer;
  HttpData *this_local;
  
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  this->nowReadPos_ = 0;
  this->state_ = STATE_PARSE_URI;
  this->hState_ = H_START;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->headers_);
  std::weak_ptr<tt::net::TimerNode>::lock
            ((weak_ptr<tt::net::TimerNode> *)
             &my_timer.super___shared_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &my_timer.super___shared_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  std::shared_ptr<tt::net::TimerNode>::~shared_ptr
            ((shared_ptr<tt::net::TimerNode> *)
             &my_timer.super___shared_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (bVar1) {
    std::weak_ptr<tt::net::TimerNode>::lock((weak_ptr<tt::net::TimerNode> *)local_30);
    this_00 = std::__shared_ptr_access<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_30);
    TimerNode::clearReq(this_00);
    std::__weak_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->timer_).super___weak_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>);
    std::shared_ptr<tt::net::TimerNode>::~shared_ptr((shared_ptr<tt::net::TimerNode> *)local_30);
  }
  return;
}

Assistant:

void HttpData::reset() {
  // inBuffer_.clear();
  fileName_.clear();
  path_.clear();
  nowReadPos_ = 0;
  state_ = STATE_PARSE_URI;
  hState_ = H_START;
  headers_.clear();
  // keepAlive_ = false;
  if (timer_.lock()) {
	  std::shared_ptr<TimerNode> my_timer(timer_.lock());
    my_timer->clearReq();
    timer_.reset();
  }
}